

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [6])

{
  Message *in_stack_00000008;
  AssertionResult *in_stack_00000010;
  Message local_20;
  char (*local_18) [6];
  char (*value_local) [6];
  AssertionResult *this_local;
  
  local_18 = value;
  value_local = &this->success_;
  Message::Message(&local_20);
  Message::operator<<(&local_20,local_18);
  AppendMessage(in_stack_00000010,in_stack_00000008);
  Message::~Message((Message *)0x13d090);
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }